

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O2

Formula * Kernel::Formula::quantify(Formula *f)

{
  Entry *pEVar1;
  uint elem;
  TermList elem_00;
  List<unsigned_int> *pLVar2;
  List<Kernel::TermList> *pLVar3;
  bool bVar4;
  Formula *this;
  FIFO quantifiedVars;
  IteratorBase local_88;
  FIFO theirSorts;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> tMap;
  
  tMap._timestamp = 1;
  tMap._size = 0;
  tMap._deleted = 0;
  tMap._capacityIndex = 0;
  tMap._capacity = 0;
  tMap._nextExpansionOccupancy = 0;
  tMap._entries._0_4_ = 0;
  tMap._entries._4_4_ = 0;
  tMap._afterLast._0_4_ = 0;
  tMap._afterLast._4_4_ = 0;
  SortHelper::collectVariableSorts(f,&tMap,true);
  quantifiedVars._first = (List<unsigned_int> *)0x0;
  quantifiedVars._last = (List<unsigned_int> *)0x0;
  theirSorts._first = (List<Kernel::TermList> *)0x0;
  theirSorts._last = (List<Kernel::TermList> *)0x0;
  local_88._next = (Entry *)CONCAT44(tMap._entries._4_4_,tMap._entries._0_4_);
  local_88._last = (Entry *)CONCAT44(tMap._afterLast._4_4_,tMap._afterLast._0_4_);
  local_88._timestamp = tMap._timestamp;
  while (bVar4 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                 IteratorBase::hasNext(&local_88), bVar4) {
    pEVar1 = local_88._next + 1;
    elem = (local_88._next)->_key;
    elem_00._content = ((local_88._next)->_val)._content;
    local_88._next = pEVar1;
    if (((elem_00._content & 3) == 0) && (bVar4 = Term::isSuper((Term *)elem_00._content), bVar4)) {
      Lib::List<unsigned_int>::FIFO::pushFront(&quantifiedVars,elem);
      Lib::List<Kernel::TermList>::FIFO::pushFront(&theirSorts,elem_00);
    }
    else {
      Lib::List<unsigned_int>::FIFO::pushBack(&quantifiedVars,elem);
      Lib::List<Kernel::TermList>::FIFO::pushBack(&theirSorts,elem_00);
    }
  }
  if (quantifiedVars._first != (List<unsigned_int> *)0x0) {
    this = (Formula *)QuantifiedFormula::operator_new(0x40);
    pLVar3 = theirSorts._first;
    pLVar2 = quantifiedVars._first;
    Formula(this,FORALL);
    *(List<unsigned_int> **)(this + 1) = pLVar2;
    this[1]._label._M_dataplus._M_p = (pointer)pLVar3;
    this[1]._label._M_string_length = (size_type)f;
    f = this;
  }
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(&tMap);
  return f;
}

Assistant:

Formula* Formula::quantify(Formula* f)
{

  DHMap<unsigned,TermList> tMap;
  SortHelper::collectVariableSorts(f,tMap,/*ignoreBound=*/true);

  //we have to quantify the formula
  VList::FIFO quantifiedVars;
  SList::FIFO theirSorts;

  DHMap<unsigned,TermList>::Iterator tmit(tMap);
  while(tmit.hasNext()) {
    unsigned v;
    TermList s;
    tmit.next(v, s);
    if(s.isTerm() && s.term()->isSuper()){
      // type variable must appear at the start of the list
      quantifiedVars.pushFront(v);
      theirSorts.pushFront(s);
    } else {
      quantifiedVars.pushBack(v);
      theirSorts.pushBack(s);
    }
  }
  if(!quantifiedVars.empty()) {
    f = new QuantifiedFormula(FORALL, quantifiedVars.list(), theirSorts.list(), f);
  }
  return f;
}